

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

void mpack_store_i64(char *p,int64_t val)

{
  *(ulong *)p = (ulong)val >> 0x38 | (val & 0xff000000000000U) >> 0x28 |
                (val & 0xff0000000000U) >> 0x18 | (val & 0xff00000000U) >> 8 |
                (val & 0xff000000U) << 8 | (val & 0xff0000U) << 0x18 | (val & 0xff00U) << 0x28 |
                val << 0x38;
  return;
}

Assistant:

MPACK_INLINE void mpack_store_u64(char* p, uint64_t val) {
    #ifdef MPACK_NHSWAP64
    val = MPACK_NHSWAP64(val);
    mpack_memcpy(p, &val, sizeof(val));
    #else
    uint8_t* u = (uint8_t*)p;
    u[0] = (uint8_t)((val >> 56) & 0xFF);
    u[1] = (uint8_t)((val >> 48) & 0xFF);
    u[2] = (uint8_t)((val >> 40) & 0xFF);
    u[3] = (uint8_t)((val >> 32) & 0xFF);
    u[4] = (uint8_t)((val >> 24) & 0xFF);
    u[5] = (uint8_t)((val >> 16) & 0xFF);
    u[6] = (uint8_t)((val >>  8) & 0xFF);
    u[7] = (uint8_t)( val        & 0xFF);
    #endif
}